

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.cpp
# Opt level: O2

void __thiscall
jbcoin::RPC::detail::ErrorCategory::add
          (ErrorCategory *this,error_code_i code,string *token,string *message)

{
  pair<std::__detail::_Node_iterator<std::pair<const_jbcoin::error_code_i,_jbcoin::RPC::ErrorInfo>,_false,_true>,_bool>
  pVar1;
  error_code_i local_24;
  error_code_i *local_20;
  string *local_18;
  string *local_10;
  error_code_i *local_8;
  
  local_20 = &local_24;
  local_24 = code;
  local_18 = message;
  local_10 = token;
  local_8 = local_20;
  pVar1 = std::
          _Hashtable<jbcoin::error_code_i,std::pair<jbcoin::error_code_i_const,jbcoin::RPC::ErrorInfo>,std::allocator<std::pair<jbcoin::error_code_i_const,jbcoin::RPC::ErrorInfo>>,std::__detail::_Select1st,std::equal_to<jbcoin::error_code_i>,std::hash<jbcoin::error_code_i>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<jbcoin::error_code_i&>,std::tuple<jbcoin::error_code_i&,std::__cxx11::string_const&,std::__cxx11::string_const&>>
                    ((_Hashtable<jbcoin::error_code_i,std::pair<jbcoin::error_code_i_const,jbcoin::RPC::ErrorInfo>,std::allocator<std::pair<jbcoin::error_code_i_const,jbcoin::RPC::ErrorInfo>>,std::__detail::_Select1st,std::equal_to<jbcoin::error_code_i>,std::hash<jbcoin::error_code_i>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this,&std::piecewise_construct,&local_20,&local_18);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  Throw<std::invalid_argument,char_const(&)[21]>((char (*) [21])"duplicate error code");
}

Assistant:

void add (error_code_i code, std::string const& token,
        std::string const& message)
    {
        std::pair <Map::iterator, bool> result (
            m_map.emplace (std::piecewise_construct,
                std::forward_as_tuple (code), std::forward_as_tuple (
                    code, token, message)));
        if (! result.second)
            Throw<std::invalid_argument> ("duplicate error code");
    }